

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void Js::JavascriptArray::ArraySpliceHelper<int>
               (JavascriptArray *pnewArr,JavascriptArray *pArr,uint32 start,uint32 deleteLen,
               Var *insertArgs,uint32 insertLen,ScriptContext *scriptContext)

{
  Type *this;
  Recycler *recycler;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SparseArraySegment<int> *pSVar4;
  SparseArraySegmentBase *pSVar5;
  uint uVar6;
  SparseArraySegmentBase *pSVar7;
  Type *pTVar8;
  uint32 uVar9;
  uint uVar10;
  uint uVar11;
  SparseArraySegmentBase *seg;
  Type *pTVar12;
  Type *pTVar13;
  Type *local_58;
  Type *local_48;
  
  recycler = scriptContext->recycler;
  if ((pArr->head).ptr == (SparseArraySegmentBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1c5f,"(pArr->head)","pArr->head");
    if (!bVar2) goto LAB_00a60393;
    *puVar3 = 0;
  }
  this = &pArr->head;
  EnsureHead<int>(pArr);
  pSVar5 = (pArr->head).ptr;
  pTVar8 = this;
  pSVar7 = (SparseArraySegmentBase *)0x0;
  local_48 = this;
  do {
    uVar6 = pSVar5->left + pSVar5->size;
    if (CARRY4(pSVar5->left,pSVar5->size)) {
      uVar6 = 0xffffffff;
    }
    do {
      local_58 = pTVar8;
      seg = pSVar5;
      if ((seg == (SparseArraySegmentBase *)0x0) || (start < uVar6)) {
        bVar2 = IsInlineSegment(seg,pArr);
        if (seg == (SparseArraySegmentBase *)0x0) goto LAB_00a60093;
        uVar10 = deleteLen + start;
        uVar6 = seg->left;
        if ((uVar6 <= start) && (uVar10 <= seg->length + uVar6)) {
          pSVar5 = (seg->next).ptr;
          ArraySegmentSpliceHelper<int>
                    (pnewArr,(SparseArraySegment<int> *)seg,(Type *)local_58,start,deleteLen,
                     insertArgs,insertLen,recycler);
          while (pSVar7 = pSVar5, pSVar7 != (SparseArraySegmentBase *)0x0) {
            pSVar7->left = pSVar7->left + (insertLen - deleteLen);
            pSVar5 = (pSVar7->next).ptr;
            if (pSVar5 == (SparseArraySegmentBase *)0x0) {
              SparseArraySegmentBase::EnsureSizeInBound(pSVar7);
              pSVar5 = (pSVar7->next).ptr;
            }
          }
          if (local_58->ptr == (SparseArraySegmentBase *)0x0) {
            return;
          }
          SparseArraySegmentBase::EnsureSizeInBound(local_58->ptr);
          return;
        }
        pTVar8 = &pnewArr->head;
        if (uVar6 < start) {
          uVar6 = uVar6 + seg->length;
          uVar9 = uVar6 - start;
          if (start <= uVar6 && uVar9 != 0) {
            if ((seg->next).ptr == (SparseArraySegmentBase *)0x0) {
              pSVar4 = SparseArraySegment<int>::AllocateSegment
                                 (recycler,0,uVar9,uVar9,(SparseArraySegmentBase *)0x0);
            }
            else {
              pSVar4 = SparseArraySegment<int>::AllocateSegmentImpl<false>
                                 (recycler,0,uVar9,uVar9,(SparseArraySegmentBase *)0x0);
            }
            pSVar5 = &SparseArraySegment<int>::CopySegment
                                (recycler,pSVar4,0,(SparseArraySegment<int> *)seg,start,uVar9)->
                      super_SparseArraySegmentBase;
            (pSVar5->next).ptr = (SparseArraySegmentBase *)0x0;
            Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierSet(pTVar8,pSVar5);
            SparseArraySegment<int>::Truncate((SparseArraySegment<int> *)seg,start);
            pTVar8 = &pSVar5->next;
          }
          pSVar7 = seg;
          pTVar12 = &seg->next;
          local_48 = local_58;
        }
        else {
          pTVar13 = local_48;
          pTVar12 = local_58;
          if ((!bVar2) || (pTVar12 = local_58, start < uVar6)) goto LAB_00a5fdb6;
          uVar11 = seg->length + uVar6;
          uVar9 = uVar11 - start;
          pTVar12 = local_58;
          if (uVar11 < start || uVar9 == 0) {
            if (uVar6 != 0 || seg->length != 0) goto LAB_00a5fdb6;
            if (seg->size == 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar3 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                          ,0x1cda,"(startSeg->size != 0)","startSeg->size != 0");
              if (!bVar2) goto LAB_00a60393;
              *puVar3 = 0;
            }
            Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=(local_58,&seg->next);
          }
          else {
            if ((seg->next).ptr == (SparseArraySegmentBase *)0x0) {
              pSVar4 = SparseArraySegment<int>::AllocateSegment
                                 (recycler,0,uVar9,uVar9,(SparseArraySegmentBase *)0x0);
            }
            else {
              pSVar4 = SparseArraySegment<int>::AllocateSegmentImpl<false>
                                 (recycler,0,uVar9,uVar9,(SparseArraySegmentBase *)0x0);
            }
            pSVar5 = &SparseArraySegment<int>::CopySegment
                                (recycler,pSVar4,0,(SparseArraySegment<int> *)seg,start,uVar9)->
                      super_SparseArraySegmentBase;
            Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierSet(pTVar8,pSVar5);
            pTVar8 = &pSVar5->next;
            Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=(local_58,&seg->next);
            (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x73])(pArr,seg,0);
          }
        }
        seg = (seg->next).ptr;
        pTVar13 = local_48;
        goto LAB_00a5fdb6;
      }
      pTVar8 = &seg->next;
      pSVar5 = (seg->next).ptr;
      pSVar7 = seg;
      local_48 = local_58;
    } while (pSVar5 == (SparseArraySegmentBase *)0x0);
  } while( true );
LAB_00a5fdb6:
  local_48 = pTVar12;
  local_58 = local_48;
  if (seg == (SparseArraySegmentBase *)0x0) goto LAB_00a5fdff;
  uVar6 = seg->left;
  if (uVar10 < seg->length + uVar6) {
    bVar2 = false;
    if (pSVar7 != (SparseArraySegmentBase *)0x0) goto LAB_00a5ff3c;
    if (uVar6 != 0) goto LAB_00a5fe34;
    uVar6 = 0;
    pSVar7 = (SparseArraySegmentBase *)0x0;
    goto LAB_00a5ff3c;
  }
  pSVar5 = (seg->next).ptr;
  seg->left = uVar6 - start;
  (seg->next).ptr = (SparseArraySegmentBase *)0x0;
  Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierSet(pTVar8,seg);
  Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierSet(local_48,pSVar5);
  pTVar8 = &seg->next;
  seg = pSVar5;
  pTVar12 = local_48;
  goto LAB_00a5fdb6;
LAB_00a5fdff:
  if (pSVar7 == (SparseArraySegmentBase *)0x0) {
LAB_00a5fe34:
    if (this->ptr != seg) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1cf6,"(pArr->head == startSeg)","pArr->head == startSeg");
      if (!bVar2) goto LAB_00a60393;
      *puVar3 = 0;
    }
    EnsureHeadStartsFromZero<int>(pArr,recycler);
    pSVar7 = (pArr->head).ptr;
    if ((pSVar7 == (SparseArraySegmentBase *)0x0) || ((pSVar7->next).ptr != seg)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1cf8,"(pArr->head && pArr->head->next == startSeg)",
                                  "pArr->head && pArr->head->next == startSeg");
      if (!bVar2) goto LAB_00a60393;
      *puVar3 = 0;
      pSVar7 = this->ptr;
    }
    local_58 = &pSVar7->next;
    if (seg == (SparseArraySegmentBase *)0x0) {
      seg = (SparseArraySegmentBase *)0x0;
    }
    else {
      uVar6 = seg->left;
      bVar2 = true;
      pTVar13 = local_48;
LAB_00a5ff3c:
      local_48 = pTVar13;
      uVar11 = uVar10 - uVar6;
      if (uVar6 <= uVar10 && uVar11 != 0) {
        pSVar4 = SparseArraySegment<int>::AllocateSegment
                           (recycler,uVar6 - start,uVar11,(SparseArraySegmentBase *)0x0);
        pSVar5 = &SparseArraySegment<int>::CopySegment
                            (recycler,pSVar4,seg->left - start,(SparseArraySegment<int> *)seg,
                             seg->left,uVar11)->super_SparseArraySegmentBase;
        (pSVar5->next).ptr = (SparseArraySegmentBase *)0x0;
        Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierSet(pTVar8,pSVar5);
        Memory::MoveArray<int,int,Memory::Recycler>
                  ((int *)(seg + 1),(int *)(&seg[1].left + uVar11),(ulong)(seg->length - uVar11));
        seg->left = seg->left + uVar11;
        seg->length = seg->length - uVar11;
        SparseArraySegmentBase::CheckLengthvsSize(seg);
        SparseArraySegment<int>::Truncate((SparseArraySegment<int> *)seg,seg->length + seg->left);
        SparseArraySegmentBase::EnsureSizeInBound(seg);
        uVar6 = seg->left;
      }
      if (bVar2 && (uVar6 - deleteLen) + insertLen == 0) {
        if (uVar6 - deleteLen != start) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x1d17,"(start + insertLen == 0)","start + insertLen == 0");
          if (!bVar2) goto LAB_00a60393;
          *puVar3 = 0;
        }
        Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierSet(this,seg);
        pSVar7 = (SparseArraySegmentBase *)0x0;
        local_58 = this;
      }
    }
  }
  else {
    seg = (SparseArraySegmentBase *)0x0;
    local_48 = pTVar13;
  }
  while (pSVar5 = seg, pSVar5 != (SparseArraySegmentBase *)0x0) {
    pSVar5->left = pSVar5->left + (insertLen - deleteLen);
    seg = (pSVar5->next).ptr;
    if (seg == (SparseArraySegmentBase *)0x0) {
      SparseArraySegmentBase::EnsureSizeInBound(pSVar5);
      seg = (pSVar5->next).ptr;
    }
  }
LAB_00a60093:
  SparseArraySegmentBase::EnsureSizeInBound((pnewArr->head).ptr);
  if (pSVar7 != (SparseArraySegmentBase *)0x0) {
    SparseArraySegmentBase::EnsureSizeInBound(pSVar7);
  }
  if (insertLen == 0) {
    return;
  }
  bVar2 = VarIsImpl<Js::JavascriptNativeIntArray>((RecyclableObject *)pArr);
  if ((bVar2) ||
     (bVar2 = VarIsImpl<Js::JavascriptNativeFloatArray>((RecyclableObject *)pArr), bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1d34,
                                "(!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr))"
                                ,
                                "!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr)"
                               );
    if (!bVar2) goto LAB_00a60393;
    *puVar3 = 0;
  }
  if (pSVar7 != (SparseArraySegmentBase *)0x0) {
    uVar6 = pSVar7->left;
    if (start < uVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1d3a,"(!savePrev || savePrev->left <= start)",
                                  "!savePrev || savePrev->left <= start");
      if (!bVar2) {
LAB_00a60393:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      uVar6 = pSVar7->left;
    }
    uVar10 = pSVar7->size - (start - uVar6);
    if (start - uVar6 <= pSVar7->size && uVar10 != 0) {
      uVar9 = insertLen - uVar10;
      pSVar5 = pSVar7;
      if (uVar10 <= insertLen && uVar9 != 0) {
        bVar2 = IsInlineSegment(pSVar7,pArr);
        pSVar5 = (pSVar7->next).ptr;
        if (pSVar5 == (SparseArraySegmentBase *)0x0) {
          pSVar5 = &SparseArraySegment<int>::GrowByMin
                              ((SparseArraySegment<int> *)pSVar7,recycler,uVar9)->
                    super_SparseArraySegmentBase;
        }
        else {
          pSVar5 = &SparseArraySegment<int>::GrowByMinMax
                              ((SparseArraySegment<int> *)pSVar7,recycler,uVar9,
                               pSVar5->left - (pSVar7->left + pSVar7->size))->
                    super_SparseArraySegmentBase;
        }
        if (bVar2) {
          (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])
                    (pArr,pSVar7,0);
        }
      }
      Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierSet(local_48,pSVar5);
      pSVar5->length = (insertLen + start) - pSVar5->left;
      SparseArraySegmentBase::CheckLengthvsSize(pSVar5);
      goto LAB_00a60272;
    }
  }
  pSVar5 = &SparseArraySegment<int>::AllocateSegment(recycler,start,insertLen,local_58->ptr)->
            super_SparseArraySegmentBase;
  Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=(&pSVar5->next,local_58);
  Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierSet(local_58,pSVar5);
LAB_00a60272:
  Memory::CopyArray<int,int,Memory::Recycler>
            ((int *)(&pSVar5[1].left + (start - pSVar5->left)),(ulong)insertLen,(int *)insertArgs,
             (ulong)insertLen);
  return;
}

Assistant:

void JavascriptArray::ArraySpliceHelper(JavascriptArray* pnewArr, JavascriptArray* pArr, uint32 start, uint32 deleteLen, Var* insertArgs, uint32 insertLen, ScriptContext *scriptContext)
    {
        // Skip pnewArr->EnsureHead(): we don't use existing segment at all.
        Recycler *recycler  = scriptContext->GetRecycler();

        Field(SparseArraySegmentBase*)* prevSeg  = &pArr->head;        // holds the next pointer of previous
        Field(SparseArraySegmentBase*)* prevPrevSeg  = &pArr->head;    // this holds the previous pointer to prevSeg dirty trick.
        SparseArraySegmentBase* savePrev = nullptr;

        Assert(pArr->head); // We should never have a null head.
        pArr->EnsureHead<T>();
        SparseArraySegment<T>* startSeg = SparseArraySegment<T>::From(pArr->head);

        const uint32 limit = start + deleteLen;
        uint32 rightLimit;
        if (UInt32Math::Add(startSeg->left, startSeg->size, &rightLimit))
        {
            rightLimit = JavascriptArray::MaxArrayLength;
        }

        // Find out the segment to start delete
        while (startSeg && (rightLimit <= start))
        {
            savePrev = startSeg;
            prevPrevSeg = prevSeg;
            prevSeg = &startSeg->next;
            startSeg = SparseArraySegment<T>::From(startSeg->next);

            if (startSeg)
            {
                if (UInt32Math::Add(startSeg->left, startSeg->size, &rightLimit))
                {
                    rightLimit = JavascriptArray::MaxArrayLength;
                }
            }
        }

        bool hasInlineSegment = JavascriptArray::IsInlineSegment(startSeg, pArr);
        if (startSeg)
        {
            // Delete Phase
            if (startSeg->left <= start && (startSeg->left + startSeg->length) >= limit)
            {
                // All splice happens in one segment.
                SparseArraySegmentBase *nextSeg = startSeg->next;
                // Splice the segment first, which might OOM throw but the array would be intact.
                JavascriptArray::ArraySegmentSpliceHelper(
                    pnewArr, startSeg, SparseArraySegment<T>::AddressFrom(prevSeg),
                    start, deleteLen, insertArgs, insertLen, recycler);
                while (nextSeg)
                {
                    // adjust next segments left
                    nextSeg->left = nextSeg->left - deleteLen + insertLen;
                    if (nextSeg->next == nullptr)
                    {
                        nextSeg->EnsureSizeInBound();
                    }
                    nextSeg = nextSeg->next;
                }
                if (*prevSeg)
                {
                    (*prevSeg)->EnsureSizeInBound();
                }
                return;
            }
            else
            {
                SparseArraySegment<T>* newHeadSeg = nullptr; // pnewArr->head is null
                Field(SparseArraySegmentBase*)* prevNewHeadSeg = &pnewArr->head;

                // delete till deleteLen and reuse segments for new array if it is possible.
                // 3 steps -
                //1. delete 1st segment (which may be partial delete)
                // 2. delete next n complete segments
                // 3. delete last segment (which again may be partial delete)

                // Step (1)  -- WOOB 1116297: When left >= start, step (1) is skipped, resulting in pNewArr->head->left != 0. We need to touch up pNewArr.
                if (startSeg->left < start)
                {
                    if (start < startSeg->left + startSeg->length)
                    {
                        uint32 headDeleteLen = startSeg->left + startSeg->length - start;

                        if (startSeg->next)
                        {
                            // We know the new segment will have a next segment, so allocate it as non-leaf.
                            newHeadSeg = SparseArraySegment<T>::template AllocateSegmentImpl<false>(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        else
                        {
                            newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, 0, startSeg, start, headDeleteLen);
                        newHeadSeg->next = nullptr;
                        *prevNewHeadSeg = newHeadSeg;
                        prevNewHeadSeg = &newHeadSeg->next;
                        startSeg->Truncate(start);
                    }
                    savePrev = startSeg;
                    prevPrevSeg = prevSeg;
                    prevSeg = &startSeg->next;
                    startSeg = SparseArraySegment<T>::From(startSeg->next);
                }

                // Step (2) first we should do a hard copy if we have an inline head Segment
                else if (hasInlineSegment && nullptr != startSeg)
                {
                    // start should be in between left and left + length
                    if (startSeg->left  <= start && start < startSeg->left + startSeg->length)
                    {
                        uint32 headDeleteLen = startSeg->left + startSeg->length - start;
                        if (startSeg->next)
                        {
                            // We know the new segment will have a next segment, so allocate it as non-leaf.
                            newHeadSeg = SparseArraySegment<T>::template AllocateSegmentImpl<false>(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        else
                        {
                            newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, 0, headDeleteLen, headDeleteLen, nullptr);
                        }
                        newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, 0, startSeg, start, headDeleteLen);
                        *prevNewHeadSeg = newHeadSeg;
                        prevNewHeadSeg = &newHeadSeg->next;

                        // Remove the entire segment from the original array
                        *prevSeg = startSeg->next;
                        pArr->ClearElements(startSeg, 0);
                        startSeg = SparseArraySegment<T>::From(startSeg->next);
                    }
                    // if we have an inline head segment with 0 elements, remove it
                    else if (startSeg->left == 0 && startSeg->length == 0)
                    {
                        Assert(startSeg->size != 0);
                        *prevSeg = startSeg->next;
                        startSeg = SparseArraySegment<T>::From(startSeg->next);
                    }
                }
                // Step (2) proper
                SparseArraySegmentBase *temp = nullptr;
                while (startSeg && (startSeg->left + startSeg->length) <= limit)
                {
                    temp = startSeg->next;

                    // move that entire segment to new array
                    startSeg->left = startSeg->left - start;
                    startSeg->next = nullptr;
                    *prevNewHeadSeg = startSeg;
                    prevNewHeadSeg = &startSeg->next;

                    // Remove the entire segment from the original array
                    *prevSeg = temp;
                    startSeg = (SparseArraySegment<T>*)temp;
                }

                // Step(2) above could delete the original head segment entirely, causing current head not
                // starting from 0. Then if any of the following throw, we have a corrupted array. Need
                // protection here.
                bool dummyHeadNodeInserted = false;
                if (!savePrev && (!startSeg || startSeg->left != 0))
                {
                    Assert(pArr->head == startSeg);
                    pArr->EnsureHeadStartsFromZero<T>(recycler);
                    Assert(pArr->head && pArr->head->next == startSeg);

                    savePrev = pArr->head;
                    prevPrevSeg = prevSeg;
                    prevSeg = &pArr->head->next;
                    dummyHeadNodeInserted = true;
                }

                // Step (3)
                if (startSeg && (startSeg->left < limit))
                {
                    // copy the first part of the last segment to be deleted to new array
                    uint32 headDeleteLen = start + deleteLen - startSeg->left ;

                    newHeadSeg = SparseArraySegment<T>::AllocateSegment(recycler, startSeg->left -  start, headDeleteLen, (SparseArraySegmentBase *)nullptr);
                    newHeadSeg = SparseArraySegment<T>::CopySegment(recycler, newHeadSeg, startSeg->left -  start, startSeg, startSeg->left, headDeleteLen);
                    newHeadSeg->next = nullptr;
                    *prevNewHeadSeg = newHeadSeg;
                    prevNewHeadSeg = &newHeadSeg->next;

                    // move the last segment
                    MoveArray(startSeg->elements, startSeg->elements + headDeleteLen, startSeg->length - headDeleteLen);
                    startSeg->left = startSeg->left + headDeleteLen; // We are moving the left ahead to point to the right index
                    startSeg->length = startSeg->length - headDeleteLen;
                    startSeg->CheckLengthvsSize();
                    startSeg->Truncate(startSeg->left + startSeg->length);
                    startSeg->EnsureSizeInBound(); // Just truncated, size might exceed next.left
                }

                if (startSeg && ((startSeg->left - deleteLen + insertLen) == 0) && dummyHeadNodeInserted)
                {
                    Assert(start + insertLen == 0);
                    // Remove the dummy head node to preserve array consistency.
                    pArr->head = startSeg;
                    savePrev = nullptr;
                    prevSeg = &pArr->head;
                }

                while (startSeg)
                {
                    startSeg->left = startSeg->left - deleteLen + insertLen ;
                    if (startSeg->next == nullptr)
                    {
                        startSeg->EnsureSizeInBound();
                    }
                    startSeg = SparseArraySegment<T>::From(startSeg->next);
                }
            }
        }

        // The size of pnewArr head allocated in above step 1 might exceed next.left concatenated in step 2/3.
        pnewArr->head->EnsureSizeInBound();
        if (savePrev)
        {
            savePrev->EnsureSizeInBound();
        }

        // insert elements
        if (insertLen > 0)
        {
            Assert(!VarIs<JavascriptNativeIntArray>(pArr) && !VarIs<JavascriptNativeFloatArray>(pArr));

            // InsertPhase
            SparseArraySegment<T> *segInsert = nullptr;

            // see if we are just about the right of the previous segment
            Assert(!savePrev || savePrev->left <= start);
            if (savePrev && (start - savePrev->left < savePrev->size))
            {
                segInsert = (SparseArraySegment<T>*)savePrev;
                uint32 spaceLeft = segInsert->size - (start - segInsert->left);
                if(spaceLeft < insertLen)
                {
                    SparseArraySegment<T> *oldSegInsert = segInsert;
                    bool isInlineSegment = JavascriptArray::IsInlineSegment(segInsert, pArr);
                    if (!segInsert->next)
                    {
                        segInsert = segInsert->GrowByMin(recycler, insertLen - spaceLeft);
                    }
                    else
                    {
                        segInsert = segInsert->GrowByMinMax(recycler, insertLen - spaceLeft, segInsert->next->left - segInsert->left - segInsert->size);
                    }

                    if (isInlineSegment)
                    {
                        pArr->ClearElements(oldSegInsert, 0);
                    }
                }
                *prevPrevSeg = segInsert;
                segInsert->length = start + insertLen - segInsert->left;
                segInsert->CheckLengthvsSize();
            }
            else
            {
                segInsert = SparseArraySegment<T>::AllocateSegment(recycler, start, insertLen, *prevSeg);
                segInsert->next = *prevSeg;
                *prevSeg = segInsert;
                savePrev = segInsert;
            }

            uint32 relativeStart = start - segInsert->left;
            // inserted elements starts at argument 3 of splice(start, deleteNumber, insertelem1, insertelem2, insertelem3, ...);
            CopyArray(segInsert->elements + relativeStart, insertLen,
                      reinterpret_cast<const T*>(insertArgs), insertLen);
        }
    }